

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrintValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)2002>(Result *__return_storage_ptr__,Model *format)

{
  pointer pcVar1;
  int iVar2;
  Arena *pAVar3;
  Rep *pRVar4;
  bool bVar5;
  RepeatedPtrIterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  RVar6;
  long *plVar7;
  ostream *poVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  long lVar10;
  size_type sVar11;
  undefined1 auVar12 [8];
  _Alloc_hider _Var13;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  undefined1 *puVar14;
  undefined1 *puVar15;
  ModelDescription *pMVar16;
  long lVar17;
  undefined8 *puVar18;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_01;
  Result result;
  FeatureDescription modelOutputFeature;
  stringstream ss;
  allocator_type local_241;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_240;
  _Alloc_hider local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined1 local_218 [48];
  string local_1e8;
  long local_1c8;
  void **local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar16 = format->description_;
  if (pMVar16 == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d2) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Model not a vision feature print.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    sVar11 = local_1a8._0_8_;
    _Var13._M_p = (pointer)local_1b8;
    if (local_1b8 == (undefined1  [8])local_1a8) {
      return __return_storage_ptr__;
    }
    goto LAB_00317e99;
  }
  Result::Result((Result *)&local_240);
  local_1e8._M_dataplus._M_p._0_4_ = 4;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1e8;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_218,__l,&local_241);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_1b8,(CoreML *)&pMVar16->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_218,in_R8
            );
  local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8;
  std::__cxx11::string::operator=((string *)&local_238,(string *)&local_1b0);
  pcVar1 = local_1a8 + 8;
  if (local_1b0._M_p != pcVar1) {
    operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
  }
  if ((_func_int **)local_218._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
  }
  bVar5 = Result::good((Result *)&local_240);
  if (!bVar5) goto LAB_00317a59;
  if (format->_oneof_case_[0] == 0x7d2) {
    puVar15 = (undefined1 *)(format->Type_).pipeline_;
  }
  else {
    puVar15 = Specification::CoreMLModels::_VisionFeaturePrint_default_instance_;
  }
  iVar2 = (((Pipeline *)puVar15)->models_).super_RepeatedPtrFieldBase.total_size_;
  if (iVar2 == 0) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Type for vision feature print not set","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    goto LAB_00317ae8;
  }
  if (iVar2 == 0x14) {
    iVar2 = *(int *)((((Pipeline *)puVar15)->models_).super_RepeatedPtrFieldBase.arena_ + 0x10);
    if (iVar2 - 1U < 2) {
      local_1e8._M_dataplus._M_p._0_4_ = 5;
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)&local_1e8;
      std::
      vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
      ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                *)local_218,__l_00,&local_241);
      validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                ((Result *)local_1b8,(CoreML *)&pMVar16->output_,
                 (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_218,
                 in_R8);
      local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1b8;
      std::__cxx11::string::operator=((string *)&local_238,(string *)&local_1b0);
      if (local_1b0._M_p != pcVar1) {
        operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
      }
      if ((_func_int **)local_218._0_8_ != (_func_int **)0x0) {
        operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
      }
      Result::good((Result *)&local_240);
      goto LAB_00317a59;
    }
    if (iVar2 == 0) {
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Version for scene is invalid","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
      goto LAB_00317ae8;
    }
    std::__cxx11::to_string(&local_1e8,iVar2);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218,
                   "Version: \'",&local_1e8);
    plVar7 = (long *)std::__cxx11::string::append(local_218);
    local_1b8 = (undefined1  [8])local_1a8;
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_1a8._0_8_ = paVar9->_M_allocated_capacity;
      local_1a8._8_8_ = plVar7[3];
    }
    else {
      local_1a8._0_8_ = paVar9->_M_allocated_capacity;
      local_1b8 = (undefined1  [8])*plVar7;
    }
    local_1b0._M_p = (pointer)plVar7[1];
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
LAB_00317e33:
    if (local_1b8 != (undefined1  [8])local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
    }
    if ((undefined1 *)local_218._0_8_ != local_218 + 0x10) {
      operator_delete((void *)local_218._0_8_,(ulong)(local_218._16_8_ + 1));
    }
    auVar12 = (undefined1  [8])
              CONCAT44(local_1e8._M_dataplus._M_p._4_4_,local_1e8._M_dataplus._M_p._0_4_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,local_1e8._M_dataplus._M_p._0_4_) !=
        &local_1e8.field_2) goto LAB_00317e7e;
  }
  else if (iVar2 == 0x15) {
    pAVar3 = (((Pipeline *)puVar15)->models_).super_RepeatedPtrFieldBase.arena_;
    iVar2 = *(int *)(pAVar3 + 0x28);
    if (iVar2 == 1) {
      if (*(int *)(pAVar3 + 0x18) == 2) {
        local_1e8._M_dataplus._M_p._0_4_ = 5;
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)&local_1e8;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)local_218,__l_01,&local_241);
        validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
                  ((Result *)local_1b8,(CoreML *)&pMVar16->output_,
                   (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x2,(int)local_218
                   ,in_R8);
        local_240 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1b8;
        std::__cxx11::string::operator=((string *)&local_238,(string *)&local_1b0);
        if (local_1b0._M_p != pcVar1) {
          operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
        }
        if ((_func_int **)local_218._0_8_ != (_func_int **)0x0) {
          operator_delete((void *)local_218._0_8_,local_218._16_8_ - local_218._0_8_);
        }
        bVar5 = Result::good((Result *)&local_240);
        if (bVar5) {
          pRVar4 = (pMVar16->output_).super_RepeatedPtrFieldBase.rep_;
          local_1c0 = pRVar4->elements;
          if (pRVar4 == (Rep *)0x0) {
            local_1c0 = (void **)0x0;
          }
          local_1c8 = (long)(pMVar16->output_).super_RepeatedPtrFieldBase.current_size_;
          if (local_1c8 != 0) {
            local_1c8 = local_1c8 << 3;
            lVar17 = 0;
            do {
              Specification::FeatureDescription::FeatureDescription
                        ((FeatureDescription *)local_218,
                         *(FeatureDescription **)((long)local_1c0 + lVar17));
              puVar14 = Specification::CoreMLModels::_VisionFeaturePrint_Objects_default_instance_;
              if ((((Pipeline *)puVar15)->models_).super_RepeatedPtrFieldBase.total_size_ == 0x15) {
                puVar14 = (((Pipeline *)puVar15)->models_).super_RepeatedPtrFieldBase.arena_;
              }
              puVar18 = (undefined8 *)(local_218._16_8_ & 0xfffffffffffffffe);
              lVar10 = *(long *)((Arena *)puVar14 + 0x20) + 8;
              if (*(long *)((Arena *)puVar14 + 0x20) == 0) {
                lVar10 = 0;
              }
              RVar6 = std::
                      __find_if<google::protobuf::internal::RepeatedPtrIterator<std::__cxx11::string_const>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                                (lVar10,lVar10 + (long)*(int *)((Arena *)puVar14 + 0x18) * 8,puVar18
                                );
              lVar10 = *(long *)((Arena *)puVar14 + 0x20) + 8;
              if (*(long *)((Arena *)puVar14 + 0x20) == 0) {
                lVar10 = 0;
              }
              if (RVar6.it_ == (void **)(lVar10 + (long)*(int *)((Arena *)puVar14 + 0x18) * 8)) {
                std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,"Model description declares an output: ",0x26);
                poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                                   ((ostream *)local_1a8,(char *)*puVar18,puVar18[1]);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8," but it is not declared in Vision Feature Print output",0x36);
                std::__cxx11::stringbuf::str();
                Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_1e8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_1e8._M_dataplus._M_p._4_4_,local_1e8._M_dataplus._M_p._0_4_)
                    != &local_1e8.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_1e8._M_dataplus._M_p._4_4_,
                                           local_1e8._M_dataplus._M_p._0_4_),
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
                std::ios_base::~ios_base(local_138);
                Specification::FeatureDescription::~FeatureDescription
                          ((FeatureDescription *)local_218);
                goto LAB_00317e86;
              }
              Specification::FeatureDescription::~FeatureDescription
                        ((FeatureDescription *)local_218);
              lVar17 = lVar17 + 8;
            } while (local_1c8 != lVar17);
          }
        }
        goto LAB_00317a59;
      }
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Two outputs for objects need to be provided","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    }
    else {
      if (iVar2 != 0) {
        std::__cxx11::to_string(&local_1e8,iVar2);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_218,"Version: \'",&local_1e8);
        plVar7 = (long *)std::__cxx11::string::append(local_218);
        local_1b8 = (undefined1  [8])local_1a8;
        paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 == paVar9) {
          local_1a8._0_8_ = paVar9->_M_allocated_capacity;
          local_1a8._8_8_ = plVar7[3];
        }
        else {
          local_1a8._0_8_ = paVar9->_M_allocated_capacity;
          local_1b8 = (undefined1  [8])*plVar7;
        }
        local_1b0._M_p = (pointer)plVar7[1];
        *plVar7 = (long)paVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
        goto LAB_00317e33;
      }
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Version for objects is invalid","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    }
LAB_00317ae8:
    local_1e8.field_2._M_allocated_capacity = local_1a8._0_8_;
    auVar12 = local_1b8;
    if (local_1b8 != (undefined1  [8])local_1a8) {
LAB_00317e7e:
      operator_delete((void *)auVar12,local_1e8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_00317a59:
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_240;
    paVar9 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar9;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_p == &local_228) {
      paVar9->_M_allocated_capacity =
           CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_228._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_238._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_230;
    local_230 = 0;
    local_228._M_local_buf[0] = '\0';
    local_238._M_p = (pointer)&local_228;
  }
LAB_00317e86:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_p == &local_228) {
    return __return_storage_ptr__;
  }
  sVar11 = CONCAT71(local_228._M_allocated_capacity._1_7_,local_228._M_local_buf[0]);
  _Var13._M_p = local_238._M_p;
LAB_00317e99:
  operator_delete(_Var13._M_p,sVar11 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_visionFeaturePrint>(const Specification::Model &format) {
        const auto &interface = format.description();

        // make sure model is a vision feature print
        if (!format.has_visionfeatureprint()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a vision feature print.");
        }

        Result result;

        // validate the inputs: only one input with image type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kImageType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &visionFeaturePrint = format.visionfeatureprint();
        switch (visionFeaturePrint.VisionFeaturePrintType_case()) {
            case Specification::CoreMLModels::VisionFeaturePrint::kScene:
                if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for scene is invalid");
                } else if (visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_1 || visionFeaturePrint.scene().version() == Specification::CoreMLModels::VisionFeaturePrint_Scene_SceneVersion_SCENE_VERSION_2) {
                    // validate the outputs: only one output with multiarray type is allowed for version 1 and version 2.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.scene().version()) + "' for scene print is invalid");
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::kObjects:
                if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version for objects is invalid");
                } else if (visionFeaturePrint.objects().version() == Specification::CoreMLModels::VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_1) {

                    if (visionFeaturePrint.objects().output_size() != 2) {
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, "Two outputs for objects need to be provided");
                    }

                    // validate the outputs: only two outputs with multiarray type is allowed for version 1.
                    result = validateDescriptionsContainFeatureWithTypes(interface.output(), 2, {Specification::FeatureType::kMultiArrayType});
                    if (!result.good()) {
                        return result;
                    }
                } else {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS, "Version: '" + std::to_string(visionFeaturePrint.objects().version()) + "' for object print is invalid");
                }

                for (auto modelOutputFeature : interface.output()) {
                    const std::string &modelOutputFeatureName = modelOutputFeature.name();
                    const auto &visionFeaturePrintOutputNames = visionFeaturePrint.objects().output();
                    if (find(visionFeaturePrintOutputNames.begin(), visionFeaturePrintOutputNames.end(), modelOutputFeatureName) == visionFeaturePrintOutputNames.end()) {
                        std::stringstream ss;
                        ss << "Model description declares an output: " << modelOutputFeatureName << " but it is not declared in Vision Feature Print output";
                        return Result(ResultType::INVALID_MODEL_PARAMETERS, ss.str());
                    }
                }
                break;
            case Specification::CoreMLModels::VisionFeaturePrint::VISIONFEATUREPRINTTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for vision feature print not set");
        }

        return result;
    }